

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_keypair_xonly_tweak_add
              (secp256k1_context *ctx,secp256k1_keypair *keypair,uchar *tweak32)

{
  int iVar1;
  uint uVar2;
  uint local_a8;
  int local_a4;
  int ret;
  int y_parity;
  secp256k1_scalar sk;
  secp256k1_ge pk;
  uchar *tweak32_local;
  secp256k1_keypair *keypair_local;
  secp256k1_context *ctx_local;
  
  iVar1 = secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx);
  if (iVar1 == 0) {
    secp256k1_callback_call
              (&ctx->illegal_callback,"secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx)");
    ctx_local._4_4_ = 0;
  }
  else if (keypair == (secp256k1_keypair *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"keypair != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (tweak32 == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"tweak32 != NULL");
    ctx_local._4_4_ = 0;
  }
  else {
    local_a8 = secp256k1_keypair_load
                         (ctx,(secp256k1_scalar *)&ret,(secp256k1_ge *)(sk.d + 3),keypair);
    memset(keypair,0,0x60);
    local_a4 = secp256k1_extrakeys_ge_even_y((secp256k1_ge *)(sk.d + 3));
    if (local_a4 == 1) {
      secp256k1_scalar_negate((secp256k1_scalar *)&ret,(secp256k1_scalar *)&ret);
    }
    uVar2 = secp256k1_ec_seckey_tweak_add_helper((secp256k1_scalar *)&ret,tweak32);
    local_a8 = uVar2 & local_a8;
    uVar2 = secp256k1_ec_pubkey_tweak_add_helper
                      (&ctx->ecmult_ctx,(secp256k1_ge *)(sk.d + 3),tweak32);
    local_a8 = uVar2 & local_a8;
    secp256k1_declassify(ctx,&local_a8,4);
    if (local_a8 != 0) {
      secp256k1_keypair_save(keypair,(secp256k1_scalar *)&ret,(secp256k1_ge *)(sk.d + 3));
    }
    secp256k1_scalar_clear((secp256k1_scalar *)&ret);
    ctx_local._4_4_ = local_a8;
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_keypair_xonly_tweak_add(const secp256k1_context* ctx, secp256k1_keypair *keypair, const unsigned char *tweak32) {
    secp256k1_ge pk;
    secp256k1_scalar sk;
    int y_parity;
    int ret;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx));
    ARG_CHECK(keypair != NULL);
    ARG_CHECK(tweak32 != NULL);

    ret = secp256k1_keypair_load(ctx, &sk, &pk, keypair);
    memset(keypair, 0, sizeof(*keypair));

    y_parity = secp256k1_extrakeys_ge_even_y(&pk);
    if (y_parity == 1) {
        secp256k1_scalar_negate(&sk, &sk);
    }

    ret &= secp256k1_ec_seckey_tweak_add_helper(&sk, tweak32);
    ret &= secp256k1_ec_pubkey_tweak_add_helper(&ctx->ecmult_ctx, &pk, tweak32);

    secp256k1_declassify(ctx, &ret, sizeof(ret));
    if (ret) {
        secp256k1_keypair_save(keypair, &sk, &pk);
    }

    secp256k1_scalar_clear(&sk);
    return ret;
}